

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m2vd_parser.c
# Opt level: O1

MPP_RET m2vd_convert_to_dxva(M2VDParserContext *p)

{
  int iVar1;
  int iVar2;
  M2VDDxvaParam *pMVar3;
  M2VDFrameHead *pMVar4;
  RK_S32 aRVar5 [2];
  RK_U32 RVar6;
  RK_U32 RVar7;
  uint uVar8;
  MPP_RET extraout_EAX;
  MPP_RET extraout_EAX_00;
  MPP_RET MVar9;
  M2VDFrameHead *pMVar10;
  RK_S32 *pRVar11;
  M2VDFrameHead *pMVar12;
  uint uVar13;
  MppFrame frame0;
  MppFrame frame1;
  MppFrame local_40;
  MppFrame local_38;
  
  if (((byte)m2vd_debug & 1) != 0) {
    _mpp_log_l(4,"m2vd_parser","%s: line(%d), func(%s)",(char *)0x0,"FUN_I",0x539,
               "m2vd_convert_to_dxva");
  }
  pMVar3 = p->dxva_ctx;
  pMVar10 = p->frame_ref1;
  pMVar12 = p->frame_ref0;
  uVar8 = p->bitread_ctx->used_bits;
  (pMVar3->seq).decode_width = (p->seq_head).decode_width;
  (pMVar3->seq).decode_height = (p->seq_head).decode_height;
  (pMVar3->seq).aspect_ratio_information = (p->seq_head).aspect_ratio_information;
  (pMVar3->seq).frame_rate_code = (p->seq_head).frame_rate_code;
  (pMVar3->seq).bit_rate_value = (p->seq_head).bit_rate_value;
  (pMVar3->seq).vbv_buffer_size = (p->seq_head).vbv_buffer_size;
  (pMVar3->seq).constrained_parameters_flag = (p->seq_head).constrained_parameters_flag;
  (pMVar3->seq).load_intra_quantizer_matrix = (p->seq_head).load_intra_quantizer_matrix;
  (pMVar3->seq).load_non_intra_quantizer_matrix = (p->seq_head).load_non_intra_quantizer_matrix;
  (pMVar3->seq_ext).profile_and_level_indication = (p->seq_ext_head).profile_and_level_indication;
  (pMVar3->seq_ext).progressive_sequence = (p->seq_ext_head).progressive_sequence;
  (pMVar3->seq_ext).chroma_format = (p->seq_ext_head).chroma_format;
  (pMVar3->seq_ext).low_delay = (p->seq_ext_head).low_delay;
  (pMVar3->seq_ext).frame_rate_extension_n = (p->seq_ext_head).frame_rate_extension_n;
  (pMVar3->seq_ext).frame_rate_extension_d = (p->seq_ext_head).frame_rate_extension_d;
  (pMVar3->gop).drop_flag = (p->gop_head).drop_flag;
  (pMVar3->gop).hour = (p->gop_head).hour;
  (pMVar3->gop).minute = (p->gop_head).minute;
  (pMVar3->gop).sec = (p->gop_head).sec;
  (pMVar3->gop).frame = (p->gop_head).frame;
  (pMVar3->gop).closed_gop = (p->gop_head).closed_gop;
  (pMVar3->gop).broken_link = (p->gop_head).broken_link;
  (pMVar3->pic).temporal_reference = (p->pic_head).temporal_reference;
  (pMVar3->pic).picture_coding_type = (p->pic_head).picture_coding_type;
  (pMVar3->pic).pre_picture_coding_type = (p->pic_head).pre_picture_coding_type;
  (pMVar3->pic).vbv_delay = (p->pic_head).vbv_delay;
  (pMVar3->pic).full_pel_forward_vector = (p->pic_head).full_pel_forward_vector;
  (pMVar3->pic).forward_f_code = (p->pic_head).forward_f_code;
  (pMVar3->pic).full_pel_backward_vector = (p->pic_head).full_pel_backward_vector;
  (pMVar3->pic).backward_f_code = (p->pic_head).backward_f_code;
  (pMVar3->pic).pre_temporal_reference = (p->pic_head).pre_temporal_reference;
  (pMVar3->seq_disp_ext).video_format = (p->seq_disp_ext_head).video_format;
  (pMVar3->seq_disp_ext).color_description = (p->seq_disp_ext_head).color_description;
  (pMVar3->seq_disp_ext).color_primaries = (p->seq_disp_ext_head).color_primaries;
  (pMVar3->seq_disp_ext).transfer_characteristics = (p->seq_disp_ext_head).transfer_characteristics;
  (pMVar3->seq_disp_ext).matrix_coefficients = (p->seq_disp_ext_head).matrix_coefficients;
  aRVar5 = (p->pic_code_ext_head).f_code[1];
  (pMVar3->pic_code_ext).f_code[0] = (p->pic_code_ext_head).f_code[0];
  (pMVar3->pic_code_ext).f_code[1] = aRVar5;
  (pMVar3->pic_code_ext).intra_dc_precision = (p->pic_code_ext_head).intra_dc_precision;
  (pMVar3->pic_code_ext).picture_structure = (p->pic_code_ext_head).picture_structure;
  (pMVar3->pic_code_ext).top_field_first = (p->pic_code_ext_head).top_field_first;
  (pMVar3->pic_code_ext).frame_pred_frame_dct = (p->pic_code_ext_head).frame_pred_frame_dct;
  (pMVar3->pic_code_ext).concealment_motion_vectors =
       (p->pic_code_ext_head).concealment_motion_vectors;
  (pMVar3->pic_code_ext).q_scale_type = (p->pic_code_ext_head).q_scale_type;
  (pMVar3->pic_code_ext).intra_vlc_format = (p->pic_code_ext_head).intra_vlc_format;
  (pMVar3->pic_code_ext).alternate_scan = (p->pic_code_ext_head).alternate_scan;
  (pMVar3->pic_code_ext).repeat_first_field = (p->pic_code_ext_head).repeat_first_field;
  (pMVar3->pic_code_ext).chroma_420_type = (p->pic_code_ext_head).chroma_420_type;
  (pMVar3->pic_code_ext).progressive_frame = (p->pic_code_ext_head).progressive_frame;
  (pMVar3->pic_code_ext).composite_display_flag = (p->pic_code_ext_head).composite_display_flag;
  (pMVar3->pic_code_ext).v_axis = (p->pic_code_ext_head).v_axis;
  (pMVar3->pic_code_ext).field_sequence = (p->pic_code_ext_head).field_sequence;
  (pMVar3->pic_code_ext).sub_carrier = (p->pic_code_ext_head).sub_carrier;
  (pMVar3->pic_code_ext).burst_amplitude = (p->pic_code_ext_head).burst_amplitude;
  (pMVar3->pic_code_ext).sub_carrier_phase = (p->pic_code_ext_head).sub_carrier_phase;
  (pMVar3->pic_disp_ext).frame_center_horizontal_offset[2] =
       (p->pic_disp_ext_head).frame_center_horizontal_offset[2];
  *(undefined8 *)(pMVar3->pic_disp_ext).frame_center_horizontal_offset =
       *(undefined8 *)(p->pic_disp_ext_head).frame_center_horizontal_offset;
  *(undefined8 *)(pMVar3->pic_disp_ext).frame_center_vertical_offset =
       *(undefined8 *)(p->pic_disp_ext_head).frame_center_vertical_offset;
  (pMVar3->pic_disp_ext).frame_center_vertical_offset[2] =
       (p->pic_disp_ext_head).frame_center_vertical_offset[2];
  uVar13 = (int)uVar8 >> 3 & 0xfffffff8;
  pMVar3->bitstream_length = p->frame_size - uVar13;
  pMVar3->bitstream_offset = uVar13;
  pMVar3->bitstream_start_bit = uVar8 & 0x3f;
  pMVar3->qp_tab = p->qp_tab_sw_buf;
  (pMVar3->CurrPic).field_0.bPicEntry =
       (pMVar3->CurrPic).field_0.bPicEntry & 0x80 | (byte)p->frame_cur->slot_index & 0x7f;
  pMVar4 = p->frame_cur;
  p->cur_slot_index = pMVar4->slot_index;
  iVar1 = p->frame_ref1->slot_index;
  iVar2 = p->frame_ref0->slot_index;
  pMVar3->frame_refs[0] = (anon_union_1_2_6b1cbba2_for__DXVA_PicEntry_M2V_0)0xff;
  pMVar3->frame_refs[1] = (anon_union_1_2_6b1cbba2_for__DXVA_PicEntry_M2V_0)0xff;
  pMVar3->frame_refs[2] = (anon_union_1_2_6b1cbba2_for__DXVA_PicEntry_M2V_0)0xff;
  pMVar3->frame_refs[3] = (anon_union_1_2_6b1cbba2_for__DXVA_PicEntry_M2V_0)0xff;
  if (iVar2 < 0) {
    pMVar12 = pMVar4;
  }
  if ((p->pic_head).picture_coding_type == 3) {
    if (iVar1 < 0) {
      pMVar10 = pMVar12;
    }
    local_40 = (MppFrame)0x0;
    local_38 = (MppFrame)0x0;
    pMVar3->frame_refs[0].field_0.bPicEntry =
         pMVar3->frame_refs[0].field_0.bPicEntry & 0x80 | (byte)pMVar10->slot_index & 0x7f;
    pMVar3->frame_refs[1].field_0 =
         (anon_union_1_2_6b1cbba2_for__DXVA_PicEntry_M2V_0)
         (pMVar3->frame_refs[1].field_0.bPicEntry & 0x80 | (byte)pMVar10->slot_index & 0x7f);
    pMVar3->frame_refs[2].field_0 =
         (anon_union_1_2_6b1cbba2_for__DXVA_PicEntry_M2V_0)
         (pMVar3->frame_refs[2].field_0.bPicEntry & 0x80 | (byte)pMVar12->slot_index & 0x7f);
    pMVar3->frame_refs[3].field_0 =
         (anon_union_1_2_6b1cbba2_for__DXVA_PicEntry_M2V_0)
         (pMVar3->frame_refs[3].field_0.bPicEntry & 0x80 | (byte)pMVar12->slot_index & 0x7f);
    mpp_buf_slot_get_prop(p->frame_slots,pMVar10->slot_index,SLOT_FRAME_PTR,&local_40);
    mpp_buf_slot_get_prop(p->frame_slots,pMVar12->slot_index,SLOT_FRAME_PTR,&local_38);
    RVar6 = mpp_frame_get_errinfo(local_40);
    RVar7 = mpp_frame_get_errinfo(local_38);
    uVar8 = RVar7 | RVar6;
    goto LAB_001ab7e9;
  }
  local_40 = (MppFrame)0x0;
  iVar1 = (p->pic_code_ext_head).picture_structure;
  if (iVar1 == 3) {
LAB_001ab76b:
    pRVar11 = &pMVar12->slot_index;
    pMVar3->frame_refs[0].field_0.bPicEntry =
         pMVar3->frame_refs[0].field_0.bPicEntry & 0x80 | (byte)pMVar12->slot_index & 0x7f;
LAB_001ab782:
    pMVar3->frame_refs[1].field_0 =
         (anon_union_1_2_6b1cbba2_for__DXVA_PicEntry_M2V_0)
         (pMVar3->frame_refs[1].field_0.bPicEntry & 0x80 | (byte)*pRVar11 & 0x7f);
  }
  else {
    if (iVar1 == 2) {
      if ((p->pic_code_ext_head).top_field_first == 0) goto LAB_001ab76b;
      pMVar3->frame_refs[0].field_0.bPicEntry =
           pMVar3->frame_refs[0].field_0.bPicEntry & 0x80 | (byte)p->frame_cur->slot_index & 0x7f;
      pRVar11 = &pMVar12->slot_index;
      goto LAB_001ab782;
    }
    if (iVar1 == 1) {
      if ((p->pic_code_ext_head).top_field_first != 0) goto LAB_001ab76b;
      pMVar3->frame_refs[0].field_0.bPicEntry =
           pMVar3->frame_refs[0].field_0.bPicEntry & 0x80 | (byte)pMVar12->slot_index & 0x7f;
      pRVar11 = &p->frame_cur->slot_index;
      goto LAB_001ab782;
    }
  }
  pMVar3->frame_refs[2].field_0 =
       (anon_union_1_2_6b1cbba2_for__DXVA_PicEntry_M2V_0)
       (pMVar3->frame_refs[2].field_0.bPicEntry & 0x80 | (byte)p->frame_cur->slot_index & 0x7f);
  pMVar3->frame_refs[3].field_0 =
       (anon_union_1_2_6b1cbba2_for__DXVA_PicEntry_M2V_0)
       (pMVar3->frame_refs[3].field_0.bPicEntry & 0x80 | (byte)p->frame_cur->slot_index & 0x7f);
  mpp_buf_slot_get_prop(p->frame_slots,pMVar12->slot_index,SLOT_FRAME_PTR,&local_40);
  uVar8 = mpp_frame_get_errinfo(local_40);
LAB_001ab7e9:
  RVar6 = 0;
  if (p->frame_cur->picCodingType != 1) {
    RVar6 = uVar8;
  }
  pMVar3->seq_ext_head_dec_flag = p->MPEG2_Flag;
  local_40 = (MppFrame)0x0;
  mpp_buf_slot_get_prop(p->frame_slots,p->cur_slot_index,SLOT_FRAME_PTR,&local_40);
  mpp_frame_set_errinfo(local_40,RVar6);
  MVar9 = extraout_EAX;
  if (((byte)m2vd_debug & 1) != 0) {
    _mpp_log_l(4,"m2vd_parser","%s: line(%d), func(%s)",(char *)0x0,"FUN_O",0x5ba,
               "m2vd_convert_to_dxva");
    MVar9 = extraout_EAX_00;
  }
  return MVar9;
}

Assistant:

static MPP_RET m2vd_convert_to_dxva(M2VDParserContext *p)
{
    MPP_RET ret = MPP_OK;
    m2vd_dbg_func("FUN_I");
    M2VDDxvaParam *dst = p->dxva_ctx;
    M2VDFrameHead *pfw = p->frame_ref1;
    M2VDFrameHead *pbw = p->frame_ref0;
    BitReadCtx_t *bx = p->bitread_ctx;
    RK_U32 i = 0;
    RK_U32 error_info = 0;

    RK_S32 readbits = m2vd_get_readbits(bx);

    dst->seq.decode_width                       = p->seq_head.decode_width;
    dst->seq.decode_height                      = p->seq_head.decode_height;
    dst->seq.aspect_ratio_information           = p->seq_head.aspect_ratio_information;
    dst->seq.frame_rate_code                    = p->seq_head.frame_rate_code;
    dst->seq.bit_rate_value                     = p->seq_head.bit_rate_value;
    dst->seq.vbv_buffer_size                    = p->seq_head.vbv_buffer_size;
    dst->seq.constrained_parameters_flag        = p->seq_head.constrained_parameters_flag;
    dst->seq.load_intra_quantizer_matrix        = p->seq_head.load_intra_quantizer_matrix;
    dst->seq.load_non_intra_quantizer_matrix    = p->seq_head.load_non_intra_quantizer_matrix;

    dst->seq_ext.profile_and_level_indication   = p->seq_ext_head.profile_and_level_indication;
    dst->seq_ext.progressive_sequence           = p->seq_ext_head.progressive_sequence;
    dst->seq_ext.chroma_format                  = p->seq_ext_head.chroma_format;
    dst->seq_ext.low_delay                      = p->seq_ext_head.low_delay;
    dst->seq_ext.frame_rate_extension_n         = p->seq_ext_head.frame_rate_extension_n;
    dst->seq_ext.frame_rate_extension_d         = p->seq_ext_head.frame_rate_extension_d;


    dst->gop.drop_flag           = p->gop_head.drop_flag;
    dst->gop.hour                = p->gop_head.hour;
    dst->gop.minute              = p->gop_head.minute;
    dst->gop.sec                 = p->gop_head.sec;
    dst->gop.frame               = p->gop_head.frame;
    dst->gop.closed_gop          = p->gop_head.closed_gop;
    dst->gop.broken_link         = p->gop_head.broken_link;


    dst->pic.temporal_reference             = p->pic_head.temporal_reference;
    dst->pic.picture_coding_type            = p->pic_head.picture_coding_type;
    dst->pic.pre_picture_coding_type        = p->pic_head.pre_picture_coding_type;
    dst->pic.vbv_delay                      = p->pic_head.vbv_delay;
    dst->pic.full_pel_forward_vector        = p->pic_head.full_pel_forward_vector;
    dst->pic.forward_f_code                 = p->pic_head.forward_f_code;
    dst->pic.full_pel_backward_vector       = p->pic_head.full_pel_backward_vector;
    dst->pic.backward_f_code                = p->pic_head.backward_f_code;
    dst->pic.pre_temporal_reference         = p->pic_head.pre_temporal_reference;

    dst->seq_disp_ext.video_format              = p->seq_disp_ext_head.video_format;
    dst->seq_disp_ext.color_description         = p->seq_disp_ext_head.color_description;
    dst->seq_disp_ext.color_primaries           = p->seq_disp_ext_head.color_primaries;
    dst->seq_disp_ext.transfer_characteristics  = p->seq_disp_ext_head.transfer_characteristics;
    dst->seq_disp_ext.matrix_coefficients       = p->seq_disp_ext_head.matrix_coefficients;

    memcpy(dst->pic_code_ext.f_code, p->pic_code_ext_head.f_code, 2 * 2 * sizeof(RK_S32));
    dst->pic_code_ext.intra_dc_precision            = p->pic_code_ext_head.intra_dc_precision;
    dst->pic_code_ext.picture_structure             = p->pic_code_ext_head.picture_structure;
    dst->pic_code_ext.top_field_first               = p->pic_code_ext_head.top_field_first;
    dst->pic_code_ext.frame_pred_frame_dct          = p->pic_code_ext_head.frame_pred_frame_dct;
    dst->pic_code_ext.concealment_motion_vectors    = p->pic_code_ext_head.concealment_motion_vectors;
    dst->pic_code_ext.q_scale_type                  = p->pic_code_ext_head.q_scale_type;
    dst->pic_code_ext.intra_vlc_format              = p->pic_code_ext_head.intra_vlc_format;
    dst->pic_code_ext.alternate_scan                = p->pic_code_ext_head.alternate_scan;
    dst->pic_code_ext.repeat_first_field            = p->pic_code_ext_head.repeat_first_field;
    dst->pic_code_ext.chroma_420_type               = p->pic_code_ext_head.chroma_420_type;
    dst->pic_code_ext.progressive_frame             = p->pic_code_ext_head.progressive_frame;
    dst->pic_code_ext.composite_display_flag        = p->pic_code_ext_head.composite_display_flag;
    dst->pic_code_ext.v_axis                        = p->pic_code_ext_head.v_axis;
    dst->pic_code_ext.field_sequence                = p->pic_code_ext_head.field_sequence;
    dst->pic_code_ext.sub_carrier                   = p->pic_code_ext_head.sub_carrier;
    dst->pic_code_ext.burst_amplitude               = p->pic_code_ext_head.burst_amplitude;
    dst->pic_code_ext.sub_carrier_phase             = p->pic_code_ext_head.sub_carrier_phase;

    memcpy(dst->pic_disp_ext.frame_center_horizontal_offset, p->pic_disp_ext_head.frame_center_horizontal_offset, 3 * sizeof(RK_S32));
    memcpy(dst->pic_disp_ext.frame_center_vertical_offset, p->pic_disp_ext_head.frame_center_vertical_offset, 3 * sizeof(RK_S32));

    dst->bitstream_length = p->frame_size - ((readbits >> 3) & (~7));
    dst->bitstream_offset = ((readbits >> 3) & (~7));
    dst->bitstream_start_bit = readbits & 0x3f;
    dst->qp_tab = p->qp_tab_sw_buf;
    dst->CurrPic.Index7Bits = p->frame_cur->slot_index;
    p->cur_slot_index = p->frame_cur->slot_index;

    if (p->frame_ref0->slot_index < 0)
        pbw = p->frame_cur;

    if (p->frame_ref1->slot_index < 0)
        pfw = pbw;

    for (i = 0; i < 4; i++) {
        dst->frame_refs[i].bPicEntry = 0xff;
    }
    if (p->pic_head.picture_coding_type == M2VD_CODING_TYPE_B) {
        MppFrame frame0 = NULL;
        MppFrame frame1 = NULL;
        dst->frame_refs[0].Index7Bits = pfw->slot_index;
        dst->frame_refs[1].Index7Bits = pfw->slot_index;
        dst->frame_refs[2].Index7Bits = pbw->slot_index;
        dst->frame_refs[3].Index7Bits = pbw->slot_index;
        mpp_buf_slot_get_prop(p->frame_slots, pfw->slot_index, SLOT_FRAME_PTR, &frame0);
        mpp_buf_slot_get_prop(p->frame_slots, pbw->slot_index, SLOT_FRAME_PTR, &frame1);
        error_info = mpp_frame_get_errinfo(frame0) | mpp_frame_get_errinfo(frame1);
    } else {
        MppFrame frame = NULL;
        if ((p->pic_code_ext_head.picture_structure == M2VD_PIC_STRUCT_FRAME) ||
            ((p->pic_code_ext_head.picture_structure == M2VD_PIC_STRUCT_TOP_FIELD) && p->pic_code_ext_head.top_field_first) ||
            ((p->pic_code_ext_head.picture_structure == M2VD_PIC_STRUCT_BOTTOM_FIELD) && (!p->pic_code_ext_head.top_field_first))) {
            dst->frame_refs[0].Index7Bits = pbw->slot_index;
            dst->frame_refs[1].Index7Bits = pbw->slot_index;
        } else if (p->pic_code_ext_head.picture_structure == M2VD_PIC_STRUCT_TOP_FIELD) {
            dst->frame_refs[0].Index7Bits = pbw->slot_index;
            dst->frame_refs[1].Index7Bits = p->frame_cur->slot_index;
        } else if (p->pic_code_ext_head.picture_structure == M2VD_PIC_STRUCT_BOTTOM_FIELD) {
            dst->frame_refs[0].Index7Bits = p->frame_cur->slot_index;
            dst->frame_refs[1].Index7Bits = pbw->slot_index;
        }
        dst->frame_refs[2].Index7Bits = p->frame_cur->slot_index;
        dst->frame_refs[3].Index7Bits = p->frame_cur->slot_index;
        mpp_buf_slot_get_prop(p->frame_slots, pbw->slot_index, SLOT_FRAME_PTR, &frame);
        error_info = mpp_frame_get_errinfo(frame);
    }
    if (p->frame_cur->picCodingType == M2VD_CODING_TYPE_I) {
        error_info = 0;
    }
    dst->seq_ext_head_dec_flag = p->MPEG2_Flag;
    {
        MppFrame frame = NULL;
        mpp_buf_slot_get_prop(p->frame_slots, p->cur_slot_index, SLOT_FRAME_PTR, &frame);
        mpp_frame_set_errinfo(frame, error_info);
    }
    m2vd_dbg_func("FUN_O");
    return ret;
}